

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

ushort Memory::ValidPointers<SmallAllocationBlockAttributes>::CalculateInteriorAddressIndex
                 (uint index,uint indexPerObject,uint maxObjectIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ushort uVar4;
  
  if (0xff < index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6d,"(index < TBlockAttributes::MaxSmallObjectCount)",
                       "index < TBlockAttributes::MaxSmallObjectCount");
    if (!bVar2) goto LAB_006ee4bc;
    *puVar3 = 0;
  }
  uVar4 = 0xffff;
  if ((index < maxObjectIndex) &&
     (uVar4 = (ushort)((ulong)index / (ulong)indexPerObject),
     0xfffe < (uint)((ulong)index / (ulong)indexPerObject))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x73,"(addressIndex < (32767 * 2 + 1))","addressIndex < USHRT_MAX");
    if (!bVar2) {
LAB_006ee4bc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return uVar4;
}

Assistant:

ushort ValidPointers<TBlockAttributes>::CalculateInteriorAddressIndex(uint index, uint indexPerObject, uint maxObjectIndex)
{
    Assert(index < TBlockAttributes::MaxSmallObjectCount);
    if (index >= maxObjectIndex)
    {
        return (ushort)-1;
    }
    uint addressIndex = index / indexPerObject;
    Assert(addressIndex < USHRT_MAX);
    return (ushort)addressIndex;
}